

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrandomopentest.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  uint local_41c;
  char local_418 [4];
  int i;
  zip_uint8_t buf [1024];
  char **argv_local;
  int argc_local;
  
  buf._1016_8_ = argv;
  uVar1 = zip_secure_random(local_418,0x400);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"zip_secure_random returned false\n");
    exit(1);
  }
  local_41c = 0;
  while( true ) {
    if (0x3ff < local_41c) {
      exit(0);
    }
    if (local_418[(int)local_41c] != '\0') break;
    local_41c = local_41c + 1;
  }
  fprintf(_stderr,"non-zero byte found\n");
  exit(1);
}

Assistant:

int
main(int argc, const char *argv[]) {
    zip_uint8_t buf[1024];
    int i;

#ifdef HAVE_CRYPTO
    if (!zip_secure_random(buf, sizeof(buf))) {
	fprintf(stderr, "zip_secure_random returned false\n");
	exit(1);
    }
    for (i = 0; i < sizeof(buf); i++) {
	if (buf[i] != 0) {
	    fprintf(stderr, "non-zero byte found\n");
	    exit(1);
	}
    }
#endif
    exit(0);
}